

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::SetupFeatureResolution
          (CommandLineInterface *this,DescriptorPool *pool)

{
  pointer spec;
  bool bVar1;
  uint uVar2;
  Edition EVar3;
  Edition EVar4;
  Edition minimum_edition;
  reference ppFVar5;
  Descriptor *this_00;
  LogMessage *pLVar6;
  Status *v;
  FeatureSetDefaults *from;
  string_view v_00;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions;
  undefined8 in_stack_fffffffffffffcc8;
  LogMessage local_1d0;
  Voidify local_1b9;
  FeatureSetDefaults local_1b8;
  undefined1 local_180 [8];
  Status status;
  Voidify local_159;
  Descriptor *local_158;
  unique_ptr<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
  local_150;
  undefined1 local_148 [8];
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  LogMessage local_100;
  Voidify local_e9;
  FieldDescriptor *local_e8;
  FieldDescriptor *ext;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  Edition local_a8 [2];
  LogMessage local_a0;
  Voidify local_89;
  int local_88;
  Edition local_84;
  Edition local_80 [2];
  LogMessage local_78;
  Voidify local_65 [13];
  reference local_58;
  OutputDirective *output;
  iterator __end2;
  iterator __begin2;
  vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
  *__range2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  feature_extensions;
  DescriptorPool *pool_local;
  CommandLineInterface *this_local;
  
  feature_extensions.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pool;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&__range2);
  __end2 = std::
           vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
           ::begin(&this->output_directives_);
  output = (OutputDirective *)
           std::
           vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
           ::end(&this->output_directives_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
                                *)&output);
    EVar3 = (Edition)in_stack_fffffffffffffcc8;
    if (!bVar1) {
      this_00 = FeatureSet::descriptor();
      absl::lts_20250127::Span<google::protobuf::FieldDescriptor_const*const>::
      Span<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,void,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,int>
                ((Span<google::protobuf::FieldDescriptor_const*const> *)&local_158,
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)&__range2);
      EVar4 = ProtocMinimumEdition();
      minimum_edition = MaximumKnownEdition();
      extensions.len_._0_4_ = EVar4;
      extensions.ptr_ =
           (pointer)local_150._M_t.
                    super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                    .
                    super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
                    ._M_head_impl;
      extensions.len_._4_4_ = 0;
      FeatureResolver::CompileDefaults
                ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_148,
                 (FeatureResolver *)this_00,local_158,extensions,minimum_edition,EVar3);
      bVar1 = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::ok
                        ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_148);
      spec = feature_extensions.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (bVar1) {
        from = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::value
                         ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_148);
        FeatureSetDefaults::FeatureSetDefaults(&local_1b8,from);
        DescriptorPool::SetFeatureSetDefaults
                  ((DescriptorPool *)local_180,(FeatureSetDefaults *)spec);
        FeatureSetDefaults::~FeatureSetDefaults(&local_1b8);
        bVar1 = absl::lts_20250127::Status::ok((Status *)local_180);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x623,"status.ok()");
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1d0);
          v_00 = absl::lts_20250127::Status::message((Status *)local_180);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,v_00);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_1b9,pLVar6);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_1d0);
        }
        this_local._7_1_ = 1;
        local_88 = 1;
        absl::lts_20250127::Status::~Status((Status *)local_180);
      }
      else {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  ((LogMessage *)&stack0xfffffffffffffe90,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                   ,0x61f);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)&stack0xfffffffffffffe90);
        v = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::status
                      ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_148);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::
                 operator<<<absl::lts_20250127::Status,_0>(pLVar6,v);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_159,pLVar6);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage
                  ((LogMessage *)&stack0xfffffffffffffe90);
        this_local._7_1_ = 0;
        local_88 = 1;
      }
      absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::~StatusOr
                ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_148);
LAB_01593f46:
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)&__range2);
      return (bool)(this_local._7_1_ & 1);
    }
    local_58 = __gnu_cxx::
               __normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
               ::operator*(&__end2);
    if (local_58->generator != (CodeGenerator *)0x0) {
      if (((this->experimental_editions_ & 1U) == 0) &&
         (uVar2 = (*local_58->generator->_vptr_CodeGenerator[4])(), (uVar2 & 2) != 0)) {
        EVar3 = (*local_58->generator->_vptr_CodeGenerator[7])();
        EVar4 = ProtocMinimumEdition();
        if (EVar3 != EVar4) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    (&local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x600);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar6,(char (*) [20])"Built-in generator ");
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,&local_58->name);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar6,(char (*) [30])" specifies a minimum edition ");
          local_80[0] = (*local_58->generator->_vptr_CodeGenerator[7])();
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::
                   operator<<<google::protobuf::Edition,_0>(pLVar6,local_80);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar6,(char (*) [34])" which is not the protoc minimum ");
          local_84 = ProtocMinimumEdition();
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::
                   operator<<<google::protobuf::Edition,_0>(pLVar6,&local_84);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar6,(char (*) [2])0x2073f9e);
          absl::lts_20250127::log_internal::Voidify::operator&&(local_65,pLVar6);
          absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_78);
          this_local._7_1_ = 0;
          local_88 = 1;
          goto LAB_01593f46;
        }
        EVar3 = (*local_58->generator->_vptr_CodeGenerator[8])();
        EVar4 = ProtocMaximumEdition();
        if (EVar3 != EVar4) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    (&local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x608);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar6,(char (*) [20])"Built-in generator ");
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,&local_58->name);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar6,(char (*) [30])" specifies a maximum edition ");
          local_a8[0] = (*local_58->generator->_vptr_CodeGenerator[8])();
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::
                   operator<<<google::protobuf::Edition,_0>(pLVar6,local_a8);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar6,(char (*) [34])" which is not the protoc maximum ");
          __range3._4_4_ = ProtocMaximumEdition();
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::
                   operator<<<google::protobuf::Edition,_0>(pLVar6,(Edition *)((long)&__range3 + 4))
          ;
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar6,(char (*) [2])0x2073f9e);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar6);
          absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_a0);
          this_local._7_1_ = 0;
          local_88 = 1;
          goto LAB_01593f46;
        }
      }
      (*local_58->generator->_vptr_CodeGenerator[6])(&__begin3);
      __end3 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)&__begin3);
      ext = (FieldDescriptor *)
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)&__begin3);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                         *)&ext), bVar1) {
        ppFVar5 = __gnu_cxx::
                  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  ::operator*(&__end3);
        local_e8 = *ppFVar5;
        if (local_e8 == (FieldDescriptor *)0x0) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    (&local_100,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x613);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_100);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar6,(char (*) [20])"Built-in generator ");
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,&local_58->name);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar6,(char (*) [41])" specifies an unknown feature extension.");
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_e9,pLVar6);
          absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_100);
          this_local._7_1_ = 0;
          local_88 = 1;
          goto LAB_01593bdc;
        }
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)&__range2,&local_e8);
        __gnu_cxx::
        __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
        ::operator++(&__end3);
      }
      local_88 = 4;
LAB_01593bdc:
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)&__begin3);
      if (local_88 != 4) goto LAB_01593f46;
    }
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool CommandLineInterface::SetupFeatureResolution(DescriptorPool& pool) {
  // Calculate the feature defaults for each built-in generator.  All generators
  // that support editions must agree on the supported edition range.
  std::vector<const FieldDescriptor*> feature_extensions;
  for (const auto& output : output_directives_) {
    if (output.generator == nullptr) continue;
    if (!experimental_editions_ &&
        (output.generator->GetSupportedFeatures() &
         CodeGenerator::FEATURE_SUPPORTS_EDITIONS) != 0) {
      // Only validate min/max edition on generators that advertise editions
      // support.  Generators still under development will always use the
      // correct values.
      if (output.generator->GetMinimumEdition() != ProtocMinimumEdition()) {
        ABSL_LOG(ERROR) << "Built-in generator " << output.name
                        << " specifies a minimum edition "
                        << output.generator->GetMinimumEdition()
                        << " which is not the protoc minimum "
                        << ProtocMinimumEdition() << ".";
        return false;
      }
      if (output.generator->GetMaximumEdition() != ProtocMaximumEdition()) {
        ABSL_LOG(ERROR) << "Built-in generator " << output.name
                        << " specifies a maximum edition "
                        << output.generator->GetMaximumEdition()
                        << " which is not the protoc maximum "
                        << ProtocMaximumEdition() << ".";
        return false;
      }
    }
    for (const FieldDescriptor* ext :
         output.generator->GetFeatureExtensions()) {
      if (ext == nullptr) {
        ABSL_LOG(ERROR) << "Built-in generator " << output.name
                        << " specifies an unknown feature extension.";
        return false;
      }
      feature_extensions.push_back(ext);
    }
  }
  absl::StatusOr<FeatureSetDefaults> defaults =
      FeatureResolver::CompileDefaults(
          FeatureSet::descriptor(), feature_extensions, ProtocMinimumEdition(),
          MaximumKnownEdition());
  if (!defaults.ok()) {
    ABSL_LOG(ERROR) << defaults.status();
    return false;
  }
  absl::Status status = pool.SetFeatureSetDefaults(std::move(defaults).value());
  ABSL_CHECK(status.ok()) << status.message();
  return true;
}